

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CURLSession.cpp
# Opt level: O1

void __thiscall CURLSession::set_credentials(CURLSession *this,string *username,string *password)

{
  void *pvVar1;
  
  pvVar1 = (this->m_handle)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
           _M_head_impl;
  if (pvVar1 != (void *)0x0) {
    curl_easy_setopt(pvVar1,0x6b,1);
    curl_easy_setopt((this->m_handle)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_void_*,_false>._M_head_impl,0x27bd,
                     (username->_M_dataplus)._M_p);
    curl_easy_setopt((this->m_handle)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_void_*,_false>._M_head_impl,0x27be,
                     (password->_M_dataplus)._M_p);
    return;
  }
  __assert_fail("m_handle != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adrian-007[P]camera_streamer/src/CURLSession.cpp"
                ,0x1e,"void CURLSession::set_credentials(const std::string &, const std::string &)")
  ;
}

Assistant:

void CURLSession::set_credentials(const std::string& username, const std::string& password)
{
    assert(m_handle != nullptr);

    curl_easy_setopt(m_handle.get(), CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(m_handle.get(), CURLOPT_USERNAME, username.c_str());
    curl_easy_setopt(m_handle.get(), CURLOPT_PASSWORD, password.c_str());
}